

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void FAudio_INTERNAL_DecodePCM24
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  uint8_t *buf;
  uint32_t j;
  uint32_t i;
  uint32_t samples_local;
  float *decodeCache_local;
  FAudioBuffer *buffer_local;
  FAudioVoice *voice_local;
  
  buf = buffer->pAudioData +
        (voice->field_19).src.curBufferOffset * (uint)((voice->field_19).src.format)->nBlockAlign;
  decodeCache_local = decodeCache;
  for (i = 0; i < samples; i = i + 1) {
    for (j = 0; j < ((voice->field_19).src.format)->nChannels; j = j + 1) {
      *decodeCache_local =
           (float)((int)((uint)buf[j * 3 + 2] << 0x18 | (uint)buf[j * 3 + 1] << 0x10 |
                        (uint)buf[j * 3] << 8) >> 8) / 8388607.0;
      decodeCache_local = decodeCache_local + 1;
    }
    buf = buf + (int)(uint)((voice->field_19).src.format)->nBlockAlign;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_DecodePCM24(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	uint32_t i, j;
	const uint8_t *buf;
	LOG_FUNC_ENTER(voice->audio)

	/* FIXME: Uh... is this something that can be SIMD-ified? */
	buf = buffer->pAudioData + (
		voice->src.curBufferOffset * voice->src.format->nBlockAlign
	);
	for (i = 0; i < samples; i += 1, buf += voice->src.format->nBlockAlign)
	for (j = 0; j < voice->src.format->nChannels; j += 1)
	{
		*decodeCache++ = ((int32_t) (
			((uint32_t) buf[(j * 3) + 2] << 24) |
			((uint32_t) buf[(j * 3) + 1] << 16) |
			((uint32_t) buf[(j * 3) + 0] << 8)
		) >> 8) / 8388607.0f;
	}

	LOG_FUNC_EXIT(voice->audio)
}